

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void save_load(lda *l,io_buf *model_file,bool read,bool text)

{
  weight initial;
  uint uVar1;
  uint32_t stride;
  size_t sVar2;
  ostream *poVar3;
  version_struct *pvVar4;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  float fVar5;
  weight *v;
  uint64_t k;
  weight *w;
  uint32_t j;
  size_t K;
  size_t brw;
  stringstream msg;
  uint64_t i;
  initial_weights init;
  uint64_t length;
  vw *all;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined6 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  parameters *in_stack_fffffffffffffd98;
  sparse_parameters *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  version_struct *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  undefined4 in_stack_fffffffffffffdd8;
  uint32_t lda;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 uVar6;
  float local_20c;
  ulong local_200;
  uint local_1f0;
  char *local_1d8;
  stringstream local_1d0 [16];
  ostream local_1c0;
  ulong local_48;
  initial_weights local_3c;
  ulong local_28;
  vw *local_20;
  byte local_12;
  byte local_11;
  long local_10;
  long local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_20 = *(vw **)(in_RDI + 0x188);
  local_28 = 1L << ((byte)local_20->num_bits & 0x3f);
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_11 != 0) {
    initialize_regressor((vw *)0x21739d);
    initial = local_20->initial_t;
    fVar5 = *(float *)(local_8 + 0x10);
    uVar1 = local_20->lda;
    sVar2 = vw::length(local_20);
    local_20c = (float)sVar2;
    fVar5 = ((fVar5 / (float)uVar1) / local_20c) * 200.0;
    uVar6 = CONCAT13(local_20->random_weights,(int3)in_stack_fffffffffffffde4);
    lda = local_20->lda;
    stride = parameters::stride((parameters *)
                                CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    initial_weights::initial_weights
              (&local_3c,initial,fVar5,(bool)((byte)((uint)uVar6 >> 0x18) & 1),lda,stride);
    if (((local_20->weights).sparse & 1U) == 0) {
      dense_parameters::set_default<initial_weights,set_initial_lda_wrapper<dense_parameters>>
                ((dense_parameters *)CONCAT44(uVar6,lda),
                 (initial_weights *)CONCAT44(fVar5,in_stack_fffffffffffffdd8));
    }
    else {
      sparse_parameters::set_default<initial_weights,set_initial_lda_wrapper<sparse_parameters>>
                (in_stack_fffffffffffffda0,(initial_weights *)in_stack_fffffffffffffd98);
    }
  }
  sVar2 = v_array<int>::size((v_array<int> *)(local_10 + 0x30));
  if (sVar2 != 0) {
    local_48 = 0;
    std::__cxx11::stringstream::stringstream(local_1d0);
    do {
      uVar1 = local_20->lda;
      if (((local_11 & 1) == 0) && ((local_12 & 1) != 0)) {
        poVar3 = (ostream *)std::ostream::operator<<(&local_1c0,local_48);
        std::operator<<(poVar3," ");
      }
      if (((local_11 & 1) == 0) ||
         (in_stack_fffffffffffffdcf =
               version_struct::operator>=
                         (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8),
         (bool)in_stack_fffffffffffffdcf)) {
        in_stack_fffffffffffffdc0 =
             (char *)bin_text_read_write_fixed
                               ((io_buf *)
                                CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                                in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                (char *)in_stack_fffffffffffffdb0,
                                SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0),
                                (stringstream *)in_stack_fffffffffffffda0,
                                SUB81((ulong)in_stack_fffffffffffffd98 >> 0x38,0));
        local_1d8 = in_stack_fffffffffffffdc0;
      }
      else {
        in_stack_fffffffffffffdb8 =
             (char *)bin_text_read_write_fixed
                               ((io_buf *)
                                CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                                in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                (char *)in_stack_fffffffffffffdb0,
                                SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0),
                                (stringstream *)in_stack_fffffffffffffda0,
                                SUB81((ulong)in_stack_fffffffffffffd98 >> 0x38,0));
        local_48 = (ulong)local_1f0;
        local_1d8 = in_stack_fffffffffffffdb8;
      }
      if (local_1d8 != (char *)0x0) {
        pvVar4 = (version_struct *)
                 parameters::strided_index
                           (in_stack_fffffffffffffd98,
                            CONCAT17(in_stack_fffffffffffffd97,
                                     CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)))
        ;
        in_stack_fffffffffffffdb0 = pvVar4;
        for (local_200 = 0; local_200 < uVar1; local_200 = local_200 + 1) {
          if (((local_11 & 1) == 0) && ((local_12 & 1) != 0)) {
            in_stack_fffffffffffffda8 =
                 (ostream *)
                 std::ostream::operator<<
                           (&local_1c0,
                            (float)(&pvVar4->major)[local_200] + *(float *)(local_8 + 0xc));
            std::operator<<(in_stack_fffffffffffffda8," ");
          }
          in_stack_fffffffffffffda0 =
               (sparse_parameters *)
               bin_text_read_write_fixed
                         ((io_buf *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                          in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                          (char *)in_stack_fffffffffffffdb0,
                          SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0),
                          (stringstream *)in_stack_fffffffffffffda0,
                          SUB81((ulong)in_stack_fffffffffffffd98 >> 0x38,0));
          local_1d8 = local_1d8 + (long)&in_stack_fffffffffffffda0->_map;
        }
      }
      if ((local_12 & 1) != 0) {
        if ((local_11 & 1) == 0) {
          std::operator<<(&local_1c0,"\n");
        }
        in_stack_fffffffffffffd98 =
             (parameters *)
             bin_text_read_write_fixed
                       ((io_buf *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                        in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                        (char *)in_stack_fffffffffffffdb0,
                        SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0),
                        (stringstream *)in_stack_fffffffffffffda0,
                        SUB81((ulong)in_stack_fffffffffffffd98 >> 0x38,0));
        local_1d8 = local_1d8 + (long)&in_stack_fffffffffffffd98->sparse;
      }
      if ((local_11 & 1) == 0) {
        local_48 = local_48 + 1;
      }
      if (((local_11 & 1) != 0) || (in_stack_fffffffffffffd97 = true, local_28 <= local_48)) {
        in_stack_fffffffffffffd96 = (local_11 & 1) != 0 && local_1d8 != (char *)0x0;
        in_stack_fffffffffffffd97 = in_stack_fffffffffffffd96;
      }
    } while ((bool)in_stack_fffffffffffffd97 != false);
    std::__cxx11::stringstream::~stringstream(local_1d0);
  }
  return;
}

Assistant:

void save_load(lda &l, io_buf &model_file, bool read, bool text)
{
  vw &all = *(l.all);
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    initial_weights init(all.initial_t, (float)(l.lda_D / all.lda / all.length() * 200), all.random_weights, all.lda,
        all.weights.stride());
    if (all.weights.sparse)
      all.weights.sparse_weights.set_default<initial_weights, set_initial_lda_wrapper<sparse_parameters>>(init);
    else
      all.weights.dense_weights.set_default<initial_weights, set_initial_lda_wrapper<dense_parameters>>(init);
  }
  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    stringstream msg;
    size_t brw = 1;

    do
    {
      brw = 0;
      size_t K = all.lda;
      if (!read && text)
        msg << i << " ";

      if (!read || all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
        brw += bin_text_read_write_fixed(model_file, (char *)&i, sizeof(i), "", read, msg, text);
      else
      {
        // support 32bit build models
        uint32_t j;
        brw += bin_text_read_write_fixed(model_file, (char *)&j, sizeof(j), "", read, msg, text);
        i = j;
      }

      if (brw != 0)
      {
        weight *w = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight *v = w + k;
          if (!read && text)
            msg << *v + l.lda_rho << " ";
          brw += bin_text_read_write_fixed(model_file, (char *)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        if (!read)
          msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }
      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}